

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstant.cpp
# Opt level: O1

void TPZShapeHDivConstant<pzshape::TPZShapeQuad>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *divphi)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  TPZVec<double> div;
  TPZFNMatrix<12,_double> vecDiv;
  ulong local_190;
  TPZVec<double> local_150;
  double local_130;
  TPZFMatrix<double> local_128;
  double local_98 [13];
  
  local_128.fElem = local_98;
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 4;
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018aee30;
  local_128.fSize = 0xc;
  local_128.fGiven = local_128.fElem;
  TPZVec<int>::TPZVec(&local_128.fPivot.super_TPZVec<int>,0);
  local_128.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_128.fPivot.super_TPZVec<int>.fStore = local_128.fPivot.fExtAlloc;
  local_128.fPivot.super_TPZVec<int>.fNElements = 0;
  local_128.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_128.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_128.fWork.fStore = (double *)0x0;
  local_128.fWork.fNElements = 0;
  local_128.fWork.fNAlloc = 0;
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018aeb40;
  TPZVec<double>::TPZVec(&local_150,4);
  memset(local_128.fElem,0,
         local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
         local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
       local_128.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
  local_130 = 0.0;
  TPZVec<double>::Fill(&local_150,&local_130,0,-1);
  pztopology::TPZQuadrilateral::ComputeConstantHDiv(pt,&local_128,&local_150);
  iVar1 = (int)(data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
               fRow;
  TPZShapeH1<pzshape::TPZShapeQuad>::Shape(pt,data);
  (*(divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])();
  uVar2 = pztopology::TPZQuadrilateral::NumSides(1);
  uVar8 = 0;
  if ((int)uVar2 < 1) {
    iVar5 = 4;
  }
  else {
    lVar4 = 4;
    local_190 = 0;
    do {
      if ((local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
         (local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)local_190)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      iVar5 = (int)uVar8;
      lVar6 = (long)iVar5;
      if ((((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) || (iVar5 < 0)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      phi->fElem[(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar6] =
           local_128.fElem[local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_190] *
           (double)(data->fSideOrient).super_TPZVec<int>.fStore[local_190];
      if ((local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
         (local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)local_190)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) || (iVar5 < 0)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      phi->fElem[(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar6 + 1] =
           local_128.fElem
           [local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_190 + 1] *
           (double)(data->fSideOrient).super_TPZVec<int>.fStore[local_190];
      if (((iVar5 < 0) || ((divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6)) ||
         ((divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      divphi->fElem[lVar6] =
           local_150.fStore[local_190] *
           (double)(data->fSideOrient).super_TPZVec<int>.fStore[local_190];
      uVar3 = iVar5 + 1;
      if (1 < (data->fHDivConnectOrders).super_TPZVec<int>.fStore[local_190]) {
        lVar6 = (long)(int)uVar3;
        lVar4 = (long)(int)lVar4;
        iVar5 = 1;
        do {
          if ((((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                fRow < 2) || (lVar4 < 0)) ||
             ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fCol <= lVar4)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
              (iVar7 = (int)uVar8, iVar7 < -1)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar6] =
               -(data->fDPhi).super_TPZFMatrix<double>.fElem
                [(data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                 fRow * lVar4 + 1];
          if ((((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                fRow < 1) || (lVar4 < 0)) ||
             ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fCol <= lVar4)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) || (iVar7 < -1)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar6 + 1] =
               (data->fDPhi).super_TPZFMatrix<double>.fElem
               [(data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                fRow * lVar4];
          lVar4 = lVar4 + 1;
          iVar5 = iVar5 + 1;
          lVar6 = lVar6 + 1;
          uVar8 = (ulong)(iVar7 + 1);
        } while (iVar5 < (data->fHDivConnectOrders).super_TPZVec<int>.fStore[local_190]);
        uVar3 = iVar7 + 2;
      }
      uVar8 = (ulong)uVar3;
      iVar5 = (int)lVar4;
      local_190 = local_190 + 1;
    } while (local_190 != uVar2);
    uVar8 = (ulong)(int)uVar3;
  }
  if (iVar5 < iVar1) {
    lVar4 = (long)iVar5;
    do {
      if ((((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
            < 2) || (lVar4 < 0)) ||
         ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <=
          lVar4)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) || ((long)uVar8 < 0)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar8)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      phi->fElem[(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * uVar8] =
           -(data->fDPhi).super_TPZFMatrix<double>.fElem
            [(data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
             * lVar4 + 1];
      if ((((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
            < 1) || (lVar4 < 0)) ||
         ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <=
          lVar4)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) || ((long)uVar8 < 0)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar8)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      phi->fElem[(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * uVar8 + 1] =
           (data->fDPhi).super_TPZFMatrix<double>.fElem
           [(data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
            * lVar4];
      uVar8 = uVar8 + 1;
      lVar4 = lVar4 + 1;
    } while ((int)lVar4 < iVar1);
  }
  local_150._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  if (local_150.fStore != (double *)0x0) {
    operator_delete__(local_150.fStore);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_128,&PTR_PTR_018aedf8);
  return;
}

Assistant:

void TPZShapeHDivConstant<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &divphi)
{

    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
    const int dim = TSHAPE::Dimension;
    const int nfacets = TSHAPE::NFacets;

    // Compute constant Hdiv functions
    TPZFNMatrix<12,REAL> vecDiv(dim,nfacets);
    TPZVec<REAL> div(nfacets);
    vecDiv.Zero();
    div.Fill(0.);
    // std::cout << "FSide trans ID = " << data.fSideTransformationId << std::endl;
    TSHAPE::ComputeConstantHDiv(pt, vecDiv, div);

    int nshape = data.fPhi.Rows();
    
    if (dim == 2){
        TPZShapeH1<TSHAPE>::Shape(pt,data);    
        divphi.Zero();
        const auto nEdges = TSHAPE::NumSides(1);

        int count = 0;
        int countKernel=ncorner;
        //Edge functions
        for (int i = 0; i < nEdges; i++)
        {
            //RT0 Function
            phi(0,count) = vecDiv(0,i) * data.fSideOrient[i];
            phi(1,count) = vecDiv(1,i) * data.fSideOrient[i];
            divphi(count,0) = div[i] * data.fSideOrient[i];
            count++;

            //Kernel Hdiv
            for (int j = 1; j < data.fHDivConnectOrders[i]; j++)
            {
                phi(0,count) = -data.fDPhi(1,countKernel);
                phi(1,count) =  data.fDPhi(0,countKernel);
                count++;
                countKernel++;
            }
        }
        
        //Internal functions
        for (int i = countKernel; i < nshape; i++){
            phi(0,count) = -data.fDPhi(1,countKernel);
            phi(1,count) =  data.fDPhi(0,countKernel);
            count++;
            countKernel++;
        }
    } else if (dim == 3){
        
        divphi.Zero();
        const auto nEdges = TSHAPE::NumSides(1);
        int nshapehcurl = TPZShapeHCurlNoGrads<TSHAPE>::NHCurlShapeF(data);
        int nshape = NHDivShapeF(data);
        
        TPZFMatrix<REAL> phiAux(dim,nshapehcurl),curlPhiAux(3,nshapehcurl);
        phiAux.Zero(); curlPhiAux.Zero();

        TPZShapeHCurlNoGrads<TSHAPE>::Shape(pt,data,phiAux,curlPhiAux);
        
        int count = 0;
        int countKernel=nEdges;

        //Face functions
        for (int i = 0; i < nfacets; i++)
        {
            // std::cout << "Side orient - " << i << " " << data.fSideOrient[i] << std::endl;
            //RT0 Function
            for(auto d = 0; d < dim; d++) {
                phi(d,count) = vecDiv(d,i) * data.fSideOrient[i];
            }
            divphi(count,0) = div[i] * data.fSideOrient[i];
            count++;
        
            //Kernel HDiv functions
            for (int k = 0; k < data.fHDivNumConnectShape[nEdges]; k++){
                for(auto d = 0; d < dim; d++) {
                    phi(d,count) = curlPhiAux(d,countKernel);               
                }
                countKernel++;
                count++;
            }
        }
        //Internal Functions - HDivKernel
        for (int i = 0; i < data.fHDivNumConnectShape[TSHAPE::NSides-TSHAPE::NCornerNodes-1]; i++)
        {
            for (auto d = 0; d < dim; d++)
            {
                phi(d,count) = curlPhiAux(d,countKernel);  
            }
            countKernel++;
            count++;
        }
        // std::cout << "VecDiv = " << vecDiv << std::endl;
        // std::cout << "divphi = " << divphi << std::endl;
        // std::cout << "phi = " << phi << std::endl;
    } else {
        DebugStop();
    }
    

}